

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

void __thiscall
jaegertracing::Tracer::Tracer
          (Tracer *this,string *serviceName,shared_ptr<jaegertracing::samplers::Sampler> *sampler,
          shared_ptr<jaegertracing::reporters::Reporter> *reporter,
          shared_ptr<jaegertracing::logging::Logger> *logger,
          shared_ptr<jaegertracing::metrics::Metrics> *metrics,HeadersConfig *headersConfig,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,int options)

{
  bool bVar1;
  result_type_conflict rVar2;
  DefaultRestrictionManager *this_00;
  type restrictionManager;
  element_type *metrics_00;
  element_type *peVar3;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  __result;
  undefined1 local_1638 [8];
  random_device device;
  string local_290;
  allocator local_269;
  string local_268;
  Tag local_248;
  allocator local_1f9;
  string local_1f8 [32];
  IPAddress local_1d8;
  system_error *anon_var_0;
  allocator local_121;
  string local_120;
  Tag local_100;
  allocator local_b1;
  string local_b0;
  Tag local_90;
  shared_ptr<jaegertracing::metrics::Metrics> *local_38;
  shared_ptr<jaegertracing::metrics::Metrics> *metrics_local;
  shared_ptr<jaegertracing::logging::Logger> *logger_local;
  shared_ptr<jaegertracing::reporters::Reporter> *reporter_local;
  shared_ptr<jaegertracing::samplers::Sampler> *sampler_local;
  string *serviceName_local;
  Tracer *this_local;
  
  local_38 = metrics;
  metrics_local = (shared_ptr<jaegertracing::metrics::Metrics> *)logger;
  logger_local = (shared_ptr<jaegertracing::logging::Logger> *)reporter;
  reporter_local = (shared_ptr<jaegertracing::reporters::Reporter> *)sampler;
  sampler_local = (shared_ptr<jaegertracing::samplers::Sampler> *)serviceName;
  serviceName_local = (string *)this;
  opentracing::v3::Tracer::Tracer(&this->super_Tracer);
  std::enable_shared_from_this<jaegertracing::Tracer>::enable_shared_from_this
            (&this->super_enable_shared_from_this<jaegertracing::Tracer>);
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_004f9508;
  std::__cxx11::string::string((string *)&this->_serviceName,(string *)sampler_local);
  net::IPAddress::localIP(&this->_hostIPv4,2);
  std::shared_ptr<jaegertracing::samplers::Sampler>::shared_ptr
            (&this->_sampler,(shared_ptr<jaegertracing::samplers::Sampler> *)reporter_local);
  std::shared_ptr<jaegertracing::reporters::Reporter>::shared_ptr
            (&this->_reporter,(shared_ptr<jaegertracing::reporters::Reporter> *)logger_local);
  std::shared_ptr<jaegertracing::metrics::Metrics>::shared_ptr(&this->_metrics,local_38);
  std::shared_ptr<jaegertracing::logging::Logger>::shared_ptr
            (&this->_logger,(shared_ptr<jaegertracing::logging::Logger> *)metrics_local);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&this->_randomNumberGenerator);
  std::mutex::mutex(&this->_randomMutex);
  propagation::
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
  Propagator(&this->_textPropagator,headersConfig,&this->_metrics);
  propagation::HTTPHeaderPropagator::Propagator
            (&this->_httpHeaderPropagator,headersConfig,&this->_metrics);
  propagation::BinaryPropagator::BinaryPropagator(&this->_binaryPropagator,&this->_metrics);
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&this->_tags);
  this_00 = (DefaultRestrictionManager *)operator_new(0x10);
  baggage::DefaultRestrictionManager::DefaultRestrictionManager(this_00,0);
  std::
  unique_ptr<jaegertracing::baggage::RestrictionManager,std::default_delete<jaegertracing::baggage::RestrictionManager>>
  ::unique_ptr<std::default_delete<jaegertracing::baggage::RestrictionManager>,void>
            ((unique_ptr<jaegertracing::baggage::RestrictionManager,std::default_delete<jaegertracing::baggage::RestrictionManager>>
              *)&this->_restrictionManager,(pointer)this_00);
  restrictionManager =
       std::
       unique_ptr<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
       ::operator*(&this->_restrictionManager);
  metrics_00 = std::
               __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_metrics);
  baggage::BaggageSetter::BaggageSetter(&this->_baggageSetter,restrictionManager,metrics_00);
  this->_options = options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"jaeger.version",&local_b1);
  Tag::Tag<char_const*const&>(&local_90,&local_b0,&kJaegerClientVersion);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back
            (&this->_tags,&local_90);
  Tag::~Tag(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"hostname",&local_121);
  platform::hostname_abi_cxx11_();
  Tag::Tag<std::__cxx11::string>
            (&local_100,&local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back
            (&this->_tags,&local_100);
  Tag::~Tag(&local_100);
  std::__cxx11::string::~string((string *)&anon_var_0);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  net::IPAddress::IPAddress(&local_1d8);
  bVar1 = net::IPAddress::operator==(&this->_hostIPv4,&local_1d8);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_logger);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Unable to determine this host\'s IP address",&local_1f9)
    ;
    (*peVar3->_vptr_Logger[2])(peVar3,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"ip",&local_269);
    net::IPAddress::host_abi_cxx11_(&local_290,&this->_hostIPv4);
    Tag::Tag<std::__cxx11::string>(&local_248,&local_268,&local_290);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back
              (&this->_tags,&local_248);
    Tag::~Tag(&local_248);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  __first = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::cbegin(tags);
  __last = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::cend(tags);
  __result = std::back_inserter<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                       (&this->_tags);
  device.field_0._4992_8_ =
       std::
       copy<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                 ((__normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                   )__first._M_current,
                  (__normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                   )__last._M_current,__result);
  std::random_device::random_device((random_device *)local_1638);
  rVar2 = std::random_device::operator()((random_device *)local_1638);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&this->_randomNumberGenerator,(ulong)rVar2);
  std::random_device::~random_device((random_device *)local_1638);
  return;
}

Assistant:

Tracer(const std::string& serviceName,
           const std::shared_ptr<samplers::Sampler>& sampler,
           const std::shared_ptr<reporters::Reporter>& reporter,
           const std::shared_ptr<logging::Logger>& logger,
           const std::shared_ptr<metrics::Metrics>& metrics,
           const propagation::HeadersConfig& headersConfig,
           const std::vector<Tag>& tags,
           int options)
        : _serviceName(serviceName)
        , _hostIPv4(net::IPAddress::localIP(AF_INET))
        , _sampler(sampler)
        , _reporter(reporter)
        , _metrics(metrics)
        , _logger(logger)
        , _randomNumberGenerator()
        , _textPropagator(headersConfig, _metrics)
        , _httpHeaderPropagator(headersConfig, _metrics)
        , _binaryPropagator(_metrics)
        , _tags()
        , _restrictionManager(new baggage::DefaultRestrictionManager(0))
        , _baggageSetter(*_restrictionManager, *_metrics)
        , _options(options)
    {
        _tags.push_back(Tag(kJaegerClientVersionTagKey, kJaegerClientVersion));

        try {
            _tags.push_back(Tag(kTracerHostnameTagKey, platform::hostname()));
        } catch (const std::system_error&) {
            // Ignore hostname error.
        }

        if (_hostIPv4 == net::IPAddress()) {
            _logger->error("Unable to determine this host's IP address");
        }
        else {
            _tags.push_back(Tag(kTracerIPTagKey, _hostIPv4.host()));
        }

        std::copy(tags.cbegin(), tags.cend(), std::back_inserter(_tags));

        std::random_device device;
        _randomNumberGenerator.seed(device());
    }